

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::popSize
          (SimpleParser<avro::parsing::JsonHandler> *this)

{
  unsigned_long uVar1;
  _Elt_pointer pSVar2;
  
  pSVar2 = (this->parsingStack).c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  assertMatch(sSizeCheck,pSVar2[-1].kind_);
  uVar1 = boost::any_cast<unsigned_long>(&pSVar2[-1].extra_);
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
            (&(this->parsingStack).c);
  return uVar1;
}

Assistant:

size_t popSize() {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sSizeCheck, s.kind());
        size_t result = s.extra<size_t>();
        parsingStack.pop();
        return result;
    }